

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj,REF_INT node)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  long lVar3;
  
  printf(" %d :");
  if (((-1 < node) && (node < ref_adj->nnode)) &&
     (lVar3 = (long)ref_adj->first[(uint)node], lVar3 != -1)) {
    printf(" %d",(ulong)(uint)ref_adj->item[lVar3].ref);
    pRVar2 = ref_adj->item;
    for (iVar1 = pRVar2[lVar3].next; iVar1 != -1; iVar1 = pRVar2[iVar1].next) {
      printf(" %d",(ulong)(uint)pRVar2[iVar1].ref);
      pRVar2 = ref_adj->item;
    }
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj, REF_INT node) {
  REF_INT item, ref;
  printf(" %d :", node);
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    printf(" %d", ref);
  }
  printf("\n");

  return REF_SUCCESS;
}